

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

EStatusCode __thiscall
PDFDocumentHandler::MergePDFPageToFormXObject
          (PDFDocumentHandler *this,PDFFormXObject *inTargetFormXObject,
          unsigned_long inSourcePageIndex)

{
  unsigned_long uVar1;
  Trace *pTVar2;
  EStatusCode local_24;
  EStatusCode result;
  unsigned_long inSourcePageIndex_local;
  PDFFormXObject *inTargetFormXObject_local;
  PDFDocumentHandler *this_local;
  
  uVar1 = PDFParser::GetPagesCount(this->mParser);
  if (inSourcePageIndex < uVar1) {
    local_24 = MergePDFPageForXObject(this,inTargetFormXObject,inSourcePageIndex);
    if (local_24 != eSuccess) {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "PDFDocumentHandler::MergePDFPageToFormXObject, failed to merge page %ld",
                        inSourcePageIndex);
    }
  }
  else {
    pTVar2 = Trace::DefaultTrace();
    uVar1 = PDFParser::GetPagesCount(this->mParser);
    Trace::TraceToLog(pTVar2,
                      "PDFDocumentHandler::MergePDFPageToFormXObject, request object index %ld is larger than maximum page for input document = %ld"
                      ,inSourcePageIndex,uVar1 - 1);
    local_24 = eFailure;
  }
  return local_24;
}

Assistant:

EStatusCode PDFDocumentHandler::MergePDFPageToFormXObject(PDFFormXObject* inTargetFormXObject,
                                                          unsigned long inSourcePageIndex)
{
	EStatusCode result;
    
	if(inSourcePageIndex < mParser->GetPagesCount())
	{
		result = MergePDFPageForXObject(inTargetFormXObject,inSourcePageIndex);
		if(result != eSuccess)
			TRACE_LOG1("PDFDocumentHandler::MergePDFPageToFormXObject, failed to merge page %ld",inSourcePageIndex);
	}
	else
	{
		TRACE_LOG2(
                   "PDFDocumentHandler::MergePDFPageToFormXObject, request object index %ld is larger than maximum page for input document = %ld", 
                   inSourcePageIndex,
                   mParser->GetPagesCount()-1);
		result = eFailure;
	}
	return result;
    
}